

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

void duckdb::ListRangeFunction<duckdb::NumericRangeInfo,true>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  bool bVar2;
  idx_t iVar3;
  reference this;
  uint64_t uVar4;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this_00;
  Vector *in_RDX;
  DataChunk *in_RDI;
  idx_t range_idx;
  TYPE range_value;
  INCREMENT_TYPE increment;
  TYPE start_value;
  idx_t i_2;
  idx_t total_idx;
  long *range_data;
  idx_t i_1;
  uint64_t total_size;
  ValidityMask *result_validity;
  list_entry_t *list_data;
  idx_t i;
  VectorType result_type;
  idx_t args_size;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> info;
  size_type in_stack_fffffffffffffe28;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe30;
  idx_t in_stack_fffffffffffffe38;
  DataChunk *in_stack_fffffffffffffe40;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> *in_stack_fffffffffffffe48;
  ulong local_178;
  DataChunk *local_170;
  int64_t local_168;
  DataChunk *local_160;
  ulong local_158;
  long local_150;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> *local_148;
  ulong local_140;
  ulong local_138;
  ValidityMask *local_130;
  list_entry_t *local_128;
  DataChunk *in_stack_fffffffffffffee8;
  RangeInfoStruct<duckdb::NumericRangeInfo,_true> *in_stack_fffffffffffffef0;
  ulong uVar5;
  ulong uVar6;
  ulong local_100;
  
  RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RangeInfoStruct
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_100 = 1;
  uVar5 = 0;
  do {
    uVar6 = uVar5;
    iVar3 = DataChunk::ColumnCount((DataChunk *)0xd4bcfe);
    if (iVar3 <= uVar5) {
LAB_00d4bd99:
      local_128 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xd4bda6);
      local_130 = FlatVector::Validity((Vector *)0xd4bdc7);
      local_138 = 0;
      for (local_140 = 0; local_140 < local_100; local_140 = local_140 + 1) {
        bVar2 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RowIsValid
                          (in_stack_fffffffffffffe48,(idx_t)in_stack_fffffffffffffe40);
        if (bVar2) {
          local_128[local_140].offset = local_138;
          uVar4 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::ListLength
                            ((RangeInfoStruct<duckdb::NumericRangeInfo,_true> *)
                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          local_128[local_140].length = uVar4;
          local_138 = local_128[local_140].length + local_138;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_128[local_140].offset = local_138;
          local_128[local_140].length = 0;
        }
      }
      duckdb::ListVector::Reserve(in_RDX,local_138);
      duckdb::ListVector::GetEntry(in_RDX);
      this_00 = (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *)
                FlatVector::GetData<long>((Vector *)0xd4bf62);
      local_150 = 0;
      local_148 = this_00;
      for (local_158 = 0; local_158 < local_100; local_158 = local_158 + 1) {
        in_stack_fffffffffffffe40 =
             (DataChunk *)
             RangeInfoStruct<duckdb::NumericRangeInfo,_true>::StartListValue
                       (this_00,(idx_t)in_stack_fffffffffffffe40);
        local_160 = in_stack_fffffffffffffe40;
        local_168 = RangeInfoStruct<duckdb::NumericRangeInfo,_true>::ListIncrementValue
                              (this_00,(idx_t)in_stack_fffffffffffffe40);
        local_170 = local_160;
        for (local_178 = 0; local_178 < local_128[local_158].length; local_178 = local_178 + 1) {
          if (local_178 != 0) {
            NumericRangeInfo::Increment((int64_t *)&local_170,local_168);
          }
          (&local_148->args)[local_150] = local_170;
          local_150 = local_150 + 1;
        }
      }
      duckdb::ListVector::SetListSize(in_RDX,local_138);
      duckdb::Vector::SetVectorType((VectorType)in_RDX);
      DataChunk::size(in_RDI);
      duckdb::Vector::Verify((ulong)in_RDX);
      RangeInfoStruct<duckdb::NumericRangeInfo,_true>::~RangeInfoStruct
                ((RangeInfoStruct<duckdb::NumericRangeInfo,_true> *)in_stack_fffffffffffffe40);
      return;
    }
    this = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe30,
                      in_stack_fffffffffffffe28);
    VVar1 = Vector::GetVectorType(this);
    if (VVar1 != CONSTANT_VECTOR) {
      local_100 = DataChunk::size(in_RDI);
      goto LAB_00d4bd99;
    }
    uVar5 = uVar6 + 1;
  } while( true );
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}